

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void list_free_nodes(list_t *list)

{
  list_node_t *plVar1;
  list_node_t *__ptr;
  
  __ptr = list->head;
  while (__ptr != (list_node_t *)0x0) {
    plVar1 = __ptr->next;
    free(__ptr);
    __ptr = plVar1;
  }
  list->head = (list_node_t *)0x0;
  list->tail = (list_node_t *)0x0;
  return;
}

Assistant:

void
list_free_nodes(
    list_t* list)
{
    list_node_t* node;
    list_node_t* node_next;

    for (node = list->head; node; node = node_next) {
        node_next = node->next;
        free(node);
    }
    
    list_init(list);
}